

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin2dedma_nvidia.c
# Opt level: O0

void txt_memory_dump(mmt_memory_dump_prefix *d,mmt_buf *b,void *state)

{
  uint local_24;
  uint32_t i;
  void *state_local;
  mmt_buf *b_local;
  mmt_memory_dump_prefix *d_local;
  
  if ((d->str).len != 0) {
    fprintf(_stdout,"--0000-- %s",d + 1);
    for (local_24 = 0; local_24 < b->len >> 2; local_24 = local_24 + 1) {
      fprintf(_stdout,"0x%08x ",(ulong)b[(ulong)local_24 + 1].len);
    }
    if ((b->len & 3) != 0) {
      for (local_24 = b->len & 0xfffffffc; local_24 < b->len; local_24 = local_24 + 1) {
        fprintf(_stdout,"%02x ",(ulong)*(byte *)((long)&b[1].len + (ulong)local_24));
      }
    }
    fprintf(_stdout,"\n");
  }
  return;
}

Assistant:

static void txt_memory_dump(struct mmt_memory_dump_prefix *d, struct mmt_buf *b, void *state)
{
	if (d->str.len == 0)
		return;

	fprintf(stdout, PFX "%s", d->str.data);

	uint32_t i;
	for (i = 0; i < b->len / 4; ++i)
		fprintf(stdout, "0x%08x ", ((uint32_t *)b->data)[i]);
	if (b->len & 3)
		for (i = b->len & 0xfffffffc; i < b->len; ++i)
			fprintf(stdout, "%02x ", b->data[i]);

	fprintf(stdout, "\n");
}